

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O2

char * lj_strfmt_wfnum(SBuf *sb,SFormat sf,lua_Number n,char *p)

{
  uint32_t ndhi;
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  MSize MVar4;
  int iVar5;
  MSize MVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  char cVar19;
  int iVar20;
  uint uVar21;
  uint32_t carry;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint32_t uVar27;
  uint uVar28;
  lua_Number lVar29;
  byte *pbVar30;
  ulong uVar31;
  uint32_t *puVar32;
  bool bVar33;
  bool bVar34;
  double dVar35;
  uint local_1d4;
  int local_1c4;
  ulong local_1c0;
  char local_1b8;
  int local_1a0;
  char nd9 [9];
  char ref9 [9];
  uint local_138 [31];
  uint local_bc;
  uint local_b8;
  uint32_t local_b4 [33];
  ulong uVar26;
  
  local_1d4 = sf >> 0x10 & 0xff;
  uVar21 = (uint)((ulong)n >> 0x20);
  uVar28 = SUB84(n,0);
  if (uVar21 * 2 < 0xffe00000) {
    uVar1 = sf >> 0x18;
    uVar24 = uVar1 - 1;
    uVar26 = (ulong)uVar24;
    uVar2 = sf >> 4 & 3;
    if (uVar2 != 0) {
      if ((long)n < 0) {
        local_1b8 = '-';
      }
      else {
        if ((sf >> 9 & 1) != 0) {
          local_1a0 = 1;
          bVar33 = false;
          local_1b8 = '+';
          goto LAB_00118228;
        }
        if ((sf >> 0xb & 1) == 0) {
          bVar33 = true;
          local_1b8 = '\0';
          local_1a0 = 0;
          goto LAB_00118228;
        }
        local_1b8 = ' ';
      }
      local_1a0 = 1;
      bVar33 = false;
LAB_00118228:
      uVar11 = uVar21 >> 0x14 & 0x7ff;
      uVar16 = uVar1 + 6;
      if (0xffffff < sf) {
        uVar16 = uVar24;
      }
      uVar18 = (int)(uVar16 - 1) >> 0x1f ^ uVar16 - 1;
      if (uVar2 != 3) {
        uVar18 = uVar16;
      }
      if ((n == 0.0) && (!NAN(n))) goto LAB_00118683;
      if ((sf & 0x10) == 0) goto LAB_00118683;
      if (0xd < uVar18) goto LAB_00118683;
      uVar26 = (ulong)(uVar11 >> 6);
      if (uVar26 - 0xf < 3) goto LAB_00118683;
      local_1c4 = (int)rescale_e[uVar26];
      dVar35 = n * rescale_n[uVar26];
      if (uVar11 == 0) {
        dVar35 = dVar35 * 10000000000.0;
        local_1c4 = local_1c4 + -10;
      }
      uVar2 = (uint)((long)dVar35 - 2U >> 0x20);
      local_138[0] = uVar2 & 0xfffff | 0x100000;
      uVar27 = (uVar2 >> 0x14 & 0x7ff) - 0x433;
      lVar29 = (lua_Number)((long)dVar35 - 2U);
LAB_001186f6:
      local_138[0] = local_138[0] << 3 | SUB84(lVar29,0) >> 0x1d;
      uVar3 = nd_mul2k(local_138,0,0x1d,SUB84(lVar29,0) & 0x1fffffff,sf);
      if ((int)uVar27 < 0) {
        uVar2 = -uVar27;
        bVar34 = false;
        if (uVar3 == 0) goto LAB_0011876f;
        goto LAB_0011878f;
      }
LAB_00118723:
      uVar26 = 0;
      uVar3 = nd_mul2k(local_138,uVar3,uVar27,0,sf);
      local_1c0 = (ulong)uVar3;
LAB_0011892d:
      iVar13 = (int)uVar26;
      iVar20 = iVar13;
      if ((sf & 0x10) == 0) {
        if (uVar18 < (-iVar13 & 0x3fU) * 9) {
          uVar27 = nd_add_m10e(local_138,(uint32_t)local_1c0,'\x05',~uVar18);
          local_1c0 = (ulong)uVar27;
        }
        goto LAB_00118b7a;
      }
      uVar3 = local_138[local_1c0];
      iVar20 = -1;
      if ((iVar13 != 0) && (uVar3 == 0)) {
        local_1c0 = 0x40;
        do {
          local_1c0 = (ulong)((int)local_1c0 - 1);
          uVar3 = local_138[local_1c0];
        } while (uVar3 == 0);
        iVar20 = -0x241;
      }
      MVar4 = ndigits_dec(uVar3);
      ndhi = (uint32_t)local_1c0;
      if (local_1c4 == 0) {
LAB_00118adb:
        iVar20 = iVar20 + ndhi * 9 + MVar4;
        if (SBORROW4(uVar18 - iVar20,(-iVar13 & 0x3fU) * 9) !=
            (int)((uVar18 - iVar20) + (-iVar13 & 0x3fU) * -9) < 0) {
          uVar27 = nd_add_m10e(local_138,ndhi,'\x05',~uVar18 + iVar20);
          local_1c0 = (ulong)uVar27;
          MVar6 = ndigits_dec(local_138[uVar27]);
          iVar20 = iVar20 + (uint)(MVar4 != MVar6);
        }
        uVar21 = iVar20 + local_1c4;
        if ((sf & 0x20) == 0) {
          uVar28 = sf & 0x1000;
          goto LAB_00118c21;
        }
        uVar28 = uVar18 - uVar21;
        if (((int)uVar18 < (int)uVar21) || ((int)uVar21 < -4)) {
          uVar28 = sf & 0x1000;
          if ((local_1d4 < 6) || ((uVar28 != 0 || (uVar18 == 0)))) goto LAB_00118c21;
          iVar20 = (int)local_1c0;
          uVar28 = iVar20 - iVar13 & 0x3f;
          uVar1 = (MVar4 + uVar28 * 9) - 1;
          if (uVar18 < uVar1) {
            iVar13 = uVar18 - MVar4;
            uVar28 = (int)((uint)(ushort)((short)(iVar13 + 9U) >> 0xf) << 0x10 |
                          iVar13 + 9U & 0xffff) / -9;
            uVar26 = (ulong)(iVar20 + (uVar28 & 0xffff) & 0x3f);
            uVar28 = -(uVar28 & 0xffff) & 0x3f;
            uVar1 = uVar18;
          }
          else {
            iVar13 = uVar1 - MVar4;
          }
          uVar2 = iVar13 + uVar28 * -9 + 10;
          goto LAB_0011907e;
        }
        if ((int)uVar21 < 0) {
          local_1c0 = 0;
        }
        bVar34 = (sf >> 0xc & 1) != 0;
        iVar20 = 0;
        if ((local_1d4 == 0 || bVar34) || uVar28 == 0) {
          iVar20 = iVar13;
        }
        uVar18 = uVar28;
        if (((local_1d4 == 0 || bVar34) || uVar28 == 0) || (uVar18 = 0, iVar13 == 0))
        goto LAB_00118b7a;
        uVar21 = (0x40 - iVar13) * 9;
        if (uVar28 < uVar21) {
          uVar26 = (ulong)(0x40 - (uVar28 + 8 & 0xffff) / 9);
          uVar21 = uVar28;
        }
        uVar28 = (0x3f - (int)uVar26) * -9 + uVar21;
        goto LAB_00118d3d;
      }
      lVar8 = (long)(int)(uVar27 + ((~(ulong)lVar29 & 0xffffffffffffe) == 0));
      local_b4[0] = uVar3;
      uVar31 = (ulong)(ndhi - 1 & 0x3f);
      local_b8 = local_138[uVar31];
      uVar14 = (ulong)(ndhi + 0x3e & 0x3f);
      local_bc = local_138[uVar14];
      nd_add_m10e(local_138,ndhi,four_ulp_m_e[lVar8 * 2 + 0x8c],(int)four_ulp_m_e[lVar8 * 2 + 0x8d])
      ;
      uVar2 = (uVar18 + 1) - MVar4;
      if (uVar18 + 1 < MVar4) {
        puVar32 = local_b4;
        uVar2 = (uVar18 - MVar4) + 10;
        uVar31 = local_1c0;
LAB_00118a78:
        lj_strfmt_wuint9(nd9,local_138[uVar31]);
        lj_strfmt_wuint9(ref9,*puVar32);
        uVar31 = (ulong)uVar2;
        iVar5 = bcmp(nd9,ref9,uVar31);
        if ((iVar5 == 0) && (ref9[uVar31] < '5' == nd9[uVar31] < '5')) goto LAB_00118adb;
      }
      else if (local_138[local_1c0] == local_b4[0]) {
        puVar32 = &local_b8;
        if (8 < uVar2) {
          if (local_138[uVar31] != local_b8) goto LAB_00118683;
          puVar32 = &local_bc;
          uVar2 = uVar2 - 9;
          uVar31 = uVar14;
        }
        goto LAB_00118a78;
      }
LAB_00118683:
      local_138[0] = uVar21 & 0xfffff;
      lVar29 = n;
      if (uVar11 == 0) {
        uVar27 = 0xfffffbee;
        if (uVar28 != 0) goto LAB_001186e7;
      }
      else {
        local_138[0] = local_138[0] | 0x100000;
        uVar27 = uVar11 - 0x413;
        if (uVar28 != 0) {
LAB_001186e7:
          uVar27 = uVar27 - 0x20;
          local_1c4 = 0;
          goto LAB_001186f6;
        }
        local_1c4 = 0;
        uVar3 = 0;
        if (0x412 < uVar11) goto LAB_00118723;
      }
      uVar2 = -uVar27;
      local_1c4 = 0;
LAB_0011876f:
      local_1c0 = 0;
      if (local_138[0] != 0) {
        uVar16 = 0;
        if (local_138[0] != 0) {
          for (; (local_138[0] >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        if (uVar16 <= uVar2 && uVar2 - uVar16 != 0) {
          local_138[0] = local_138[0] >> ((byte)uVar16 & 0x1f);
          uVar3 = 0;
          bVar34 = true;
          uVar2 = uVar2 - uVar16;
LAB_0011878f:
          uVar12 = 0xffffffff;
          uVar16 = 0xffffffff;
          if (0x12 < uVar2) {
            if ((sf & 0x30) == 0x20) {
              uVar12 = (uint)(ushort)((short)((int)((uint)(ushort)((short)(uVar1 - 1) >> 0xf) <<
                                                    0x10 | uVar1 - 1 & 0xffff) / -9) + 0x3f);
              uVar16 = 0xffffffff;
            }
            else {
              iVar20 = 0x1f;
              if (local_138[uVar3] != 0) {
                for (; local_138[uVar3] >> iVar20 == 0; iVar20 = iVar20 + -1) {
                }
              }
              uVar12 = (int)((int)((double)(int)((uVar3 * 0x1d - uVar2) + iVar20) *
                                  0.30102999566398114) - uVar24) / 9 + 0x3e;
              uVar16 = (ushort)((short)uVar24 / -8 + 0x3d) + uVar3;
            }
          }
          uVar26 = 0;
          uVar31 = (ulong)uVar3;
          for (; uVar25 = (uint)uVar26, 8 < uVar2; uVar2 = uVar2 - 9) {
            uVar22 = 0;
            uVar14 = uVar31;
            do {
              uVar17 = (uint)uVar14;
              uVar23 = local_138[uVar14];
              local_138[uVar14] = (uVar23 >> 9) + uVar22;
              uVar23 = uVar23 & 0x1ff;
              uVar22 = uVar23 * 0x1dcd65;
              uVar14 = (ulong)(uVar17 - 1 & 0x3f);
            } while (uVar17 != uVar25);
            if ((uVar25 == uVar12) || (uVar25 == uVar16)) {
              if (local_138[uVar31] == 0) {
                if ((uint)uVar31 != uVar25) goto LAB_001188a5;
                goto LAB_00118913;
              }
            }
            else {
              if (uVar23 != 0) {
                uVar26 = (ulong)(uVar25 - 1 & 0x3f);
                local_138[uVar26] = uVar22;
              }
              if (local_138[uVar31] == 0) {
LAB_001188a5:
                uVar31 = (ulong)((uint)uVar31 - 1 & 0x3f);
                uVar16 = uVar16 - 1;
              }
            }
          }
          if (uVar2 != 0) {
            bVar10 = (byte)uVar2;
            uVar2 = 0;
            do {
              uVar12 = (uint)uVar31;
              uVar16 = local_138[uVar31];
              local_138[uVar31] = (uVar16 >> (bVar10 & 0x1f)) + uVar2;
              uVar2 = (uVar16 & ~(-1 << (bVar10 & 0x1f))) * (1000000000U >> (bVar10 & 0x1f));
              uVar31 = (ulong)(uVar12 - 1 & 0x3f);
            } while (uVar12 != uVar25);
            if (uVar2 != 0) {
              uVar26 = (ulong)(uVar25 - 1 & 0x3f);
              local_138[uVar26] = uVar2;
            }
          }
LAB_00118913:
          local_1c0 = 0;
          if (!bVar34) {
            local_1c0 = (ulong)(uVar3 - (local_138[uVar3] == 0));
          }
          goto LAB_0011892d;
        }
        local_138[0] = local_138[0] >> ((byte)uVar2 & 0x1f);
      }
      uVar26 = 0;
      goto LAB_0011892d;
    }
    pcVar9 = "0123456789ABCDEFPX";
    if ((sf >> 0xd & 1) == 0) {
      pcVar9 = "0123456789abcdefpx";
    }
    uVar21 = uVar21 >> 0x14 & 0x7ff;
    iVar20 = 6;
    if ((long)n < 0) {
      local_1c4._0_1_ = '-';
LAB_001182fd:
      bVar33 = false;
    }
    else {
      if ((sf >> 9 & 1) != 0) {
        local_1c4._0_1_ = '+';
        goto LAB_001182fd;
      }
      if ((sf >> 0xb & 1) != 0) {
        local_1c4._0_1_ = ' ';
        goto LAB_001182fd;
      }
      bVar33 = true;
      local_1c4._0_1_ = '\0';
      iVar20 = 5;
    }
    uVar31 = (ulong)n & 0xfffffffffffff;
    if (uVar21 == 0) {
      uVar21 = (uint)(uVar31 >> 0x20);
      if (uVar21 == 0 && uVar28 == 0) {
        uVar27 = 0;
      }
      else {
        iVar13 = 0x1f;
        if (uVar28 != 0) {
          for (; uVar28 >> iVar13 == 0; iVar13 = iVar13 + -1) {
          }
        }
        iVar5 = 0x1f;
        if (uVar21 != 0) {
          for (; uVar21 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        bVar34 = uVar31 >> 0x20 == 0;
        if (bVar34) {
          iVar5 = iVar13;
        }
        iVar5 = ((uint)bVar34 << 5 | 0x14) - iVar5;
        uVar27 = -iVar5 - 0x3fe;
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
      }
    }
    else {
      uVar31 = uVar31 + 0x10000000000000;
      uVar27 = uVar21 - 0x3ff;
    }
    if (sf < 0x1000000) {
      uVar21 = (uint)uVar31;
      if (uVar21 == 0) {
        uVar28 = (uint)(uVar31 >> 0x20) | 0x100000;
        uVar21 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar26 = (ulong)(5 - (uVar21 >> 2));
      }
      else {
        uVar28 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar26 = (ulong)(0xd - (uVar28 >> 2));
      }
    }
    else if (uVar24 < 0xd) {
      uVar31 = uVar31 + (1L << ((char)uVar24 * -4 + 0x33U & 0x3f));
    }
    uVar3 = -uVar27;
    if (0 < (int)uVar27) {
      uVar3 = uVar27;
    }
    MVar4 = ndigits_dec(uVar3);
    uVar21 = (uint)uVar26;
    uVar2 = iVar20 + uVar21 + (uint)((sf & 0x1000) != 0 || uVar21 != 0) + MVar4;
    if (p == (char *)0x0) {
      uVar28 = uVar2;
      if (uVar2 < local_1d4) {
        uVar28 = local_1d4;
      }
      uVar1 = (sb->p).ptr32;
      p = (char *)(ulong)uVar1;
      if ((sb->e).ptr32 - uVar1 < uVar28) {
        p = lj_buf_more2(sb,uVar28);
      }
    }
    if ((sf & 0x500) == 0) {
      uVar28 = local_1d4;
      if (uVar2 < local_1d4) {
        uVar28 = uVar2;
      }
      for (; uVar2 < local_1d4; local_1d4 = local_1d4 - 1) {
        *p = ' ';
        p = p + 1;
      }
      local_1d4 = uVar28 - 1;
    }
    if (!bVar33) {
      *p = (char)local_1c4;
      p = p + 1;
    }
    *p = '0';
    p[1] = ((sf >> 0xd & 1) == 0) << 5 | 0x58;
    pcVar7 = p + 2;
    if ((sf & 0x500) == 0x400) {
      uVar28 = uVar2;
      if (local_1d4 < uVar2) {
        uVar28 = local_1d4;
      }
      for (; uVar2 < local_1d4; local_1d4 = local_1d4 - 1) {
        *pcVar7 = '0';
        pcVar7 = pcVar7 + 1;
      }
      local_1d4 = uVar28 - 1;
    }
    pbVar30 = (byte *)(pcVar7 + 1);
    *pcVar7 = (char)(uVar31 >> 0x34) + '0';
    pbVar15 = pbVar30;
    if ((sf & 0x1000) != 0 || uVar21 != 0) {
      pcVar7[1] = '.';
      uVar14 = uVar26;
      if (uVar21 < 0xd) {
        uVar31 = uVar31 >> (0x34U - (char)(uVar21 << 2) & 0x3f);
      }
      else {
        for (; 0xd < uVar14; uVar14 = uVar14 - 1) {
          pbVar30[uVar14] = 0x30;
        }
      }
      pbVar15 = (byte *)(pcVar7 + uVar26 + 2);
      uVar14 = 0xd;
      if (uVar26 < 0xd) {
        uVar14 = uVar26;
      }
      while (uVar14 != 0) {
        pbVar30[uVar14] = pcVar9[(uint)uVar31 & 0xf];
        uVar31 = uVar31 >> 4;
        uVar14 = uVar14 - 1;
      }
    }
    *pbVar15 = ((sf >> 0xd & 1) == 0) << 5 | 0x50;
    pbVar15[1] = (char)((int)uVar27 >> 0x1f) * -2 + 0x2b;
    pcVar9 = lj_strfmt_wint((char *)(pbVar15 + 2),uVar3);
    goto LAB_0011902a;
  }
  uVar21 = (int)(sf << 0x12) >> 0x1f & 0x202020;
  if (uVar28 == 0 && ((ulong)n & 0xfffff00000000) == 0) {
    uVar21 = uVar21 ^ 0x696e66;
    if ((long)n < 0) {
      cVar19 = '-';
    }
    else {
      cVar19 = '+';
      if (((sf >> 9 & 1) == 0) && (cVar19 = (char)((sf & 0x800) >> 6), (sf & 0x800) == 0)) {
        bVar33 = false;
        uVar2 = 3;
        goto LAB_00118617;
      }
    }
LAB_00118611:
    uVar2 = 4;
    bVar33 = true;
  }
  else {
    uVar21 = uVar21 ^ 0x6e616e;
    cVar19 = (char)((sf & 0x800) >> 6);
    if ((sf & 0x800) != 0) goto LAB_00118611;
    bVar33 = false;
    uVar2 = 3;
  }
LAB_00118617:
  if (p == (char *)0x0) {
    uVar28 = uVar2;
    if (uVar2 < local_1d4) {
      uVar28 = local_1d4;
    }
    uVar1 = (sb->p).ptr32;
    p = (char *)(ulong)uVar1;
    if ((sb->e).ptr32 - uVar1 < uVar28) {
      p = lj_buf_more2(sb,uVar28);
    }
  }
  if ((sf >> 8 & 1) == 0) {
    uVar28 = local_1d4;
    if (uVar2 < local_1d4) {
      uVar28 = uVar2;
    }
    for (; uVar2 < local_1d4; local_1d4 = local_1d4 - 1) {
      *p = ' ';
      p = p + 1;
    }
    local_1d4 = uVar28 - 1;
  }
  if (bVar33) {
    *p = cVar19;
    p = p + 1;
  }
  *p = (char)(uVar21 >> 0x10);
  p[1] = (char)(uVar21 >> 8);
  p[2] = (char)uVar21;
  pcVar9 = p + 3;
  goto LAB_0011902a;
LAB_0011907e:
  iVar13 = (int)uVar26;
  lj_strfmt_wuint9(nd9,local_138[uVar26]);
  uVar18 = uVar1;
  do {
    uVar2 = uVar2 - 1;
    uVar28 = 0;
    uVar1 = uVar18 - 1;
    iVar5 = iVar13;
    if (uVar18 == 0) goto LAB_001190df;
    if (nd9[uVar2] != '0') goto LAB_00118c21;
    uVar18 = uVar1;
  } while (uVar2 != 0);
  iVar5 = iVar20;
  if (iVar13 == iVar20) goto LAB_001190df;
  uVar26 = (ulong)(iVar13 + 1U & 0x3f);
  uVar2 = 9;
  goto LAB_0011907e;
LAB_001190df:
  iVar13 = iVar5;
  uVar18 = 0;
LAB_00118c21:
  uVar1 = -uVar21;
  if (0 < (int)uVar21) {
    uVar1 = uVar21;
  }
  MVar4 = ndigits_dec(uVar1);
  uVar2 = (uint)(uVar28 != 0 || uVar18 != 0) + local_1a0 + uVar18 + (uint)(uVar1 < 10) + MVar4 + 3;
  if (p == (char *)0x0) {
    uVar24 = uVar2;
    if (uVar2 < local_1d4) {
      uVar24 = local_1d4;
    }
    uVar16 = (sb->p).ptr32;
    p = (char *)(ulong)uVar16;
    if ((sb->e).ptr32 - uVar16 < uVar24 + 5) {
      p = lj_buf_more2(sb,uVar24 + 5);
    }
  }
  if ((sf & 0x500) == 0) {
    uVar24 = local_1d4;
    if (uVar2 < local_1d4) {
      uVar24 = uVar2;
    }
    for (; uVar2 < local_1d4; local_1d4 = local_1d4 - 1) {
      *p = ' ';
      p = p + 1;
    }
    local_1d4 = uVar24 - 1;
  }
  if (!bVar33) {
    *p = local_1b8;
    p = p + 1;
  }
  if ((sf & 0x500) == 0x400) {
    uVar24 = uVar2;
    if (local_1d4 < uVar2) {
      uVar24 = local_1d4;
    }
    for (; uVar2 < local_1d4; local_1d4 = local_1d4 - 1) {
      *p = '0';
      p = p + 1;
    }
    local_1d4 = uVar24 - 1;
  }
  pcVar9 = lj_strfmt_wint(p + 1,local_138[local_1c0]);
  *p = p[1];
  pbVar30 = (byte *)(p + 1);
  if (uVar28 != 0 || uVar18 != 0) {
    p[1] = '.';
    lVar8 = (long)(int)(uVar18 + ((int)p - (int)pcVar9) + 2);
    while ((uVar28 = (uint)lVar8, 0 < (int)uVar28 && ((int)local_1c0 != iVar13))) {
      local_1c0 = (ulong)((int)local_1c0 - 1U & 0x3f);
      pcVar9 = lj_strfmt_wuint9(pcVar9,local_138[local_1c0]);
      lVar8 = lVar8 + -9;
    }
    if ((sf & 0x1020) == 0x20) {
      pbVar30 = (byte *)(pcVar9 + (int)((int)uVar28 >> 0x1f & uVar28));
      do {
        pbVar15 = pbVar30;
        pbVar30 = pbVar15 + -1;
      } while (pbVar15[-1] == 0x30);
      if (pbVar15[-1] != 0x2e) {
        pbVar30 = pbVar15;
      }
    }
    else {
      for (; 0 < (int)lVar8; lVar8 = lVar8 + -1) {
        *pcVar9 = '0';
        pcVar9 = pcVar9 + 1;
      }
      pbVar30 = (byte *)(pcVar9 + lVar8);
    }
  }
  *pbVar30 = ((sf >> 0xd & 1) == 0) << 5 | 0x45;
  pbVar30[1] = (char)((int)uVar21 >> 0x1f) * -2 + 0x2b;
  if (uVar1 < 10) {
    pbVar30[2] = 0x30;
    pbVar30 = pbVar30 + 3;
  }
  else {
    pbVar30 = pbVar30 + 2;
  }
  pcVar9 = lj_strfmt_wint((char *)pbVar30,uVar1);
  goto LAB_0011902a;
LAB_00118d3d:
  iVar20 = (int)uVar26;
  lj_strfmt_wuint9(nd9,local_138[uVar26]);
  uVar18 = uVar21;
  do {
    uVar28 = uVar28 - 1;
    uVar21 = uVar18 - 1;
    if (uVar18 == 0) {
      uVar18 = 0;
      goto LAB_00118b7a;
    }
    if (nd9[uVar28] != '0') goto LAB_00118b7a;
    uVar18 = uVar21;
  } while (uVar28 != 0);
  if (iVar20 == 0x3f) goto LAB_001190ed;
  uVar26 = (ulong)(iVar20 + 1);
  uVar28 = 9;
  goto LAB_00118d3d;
LAB_001190ed:
  iVar20 = 0x3f;
  uVar18 = 0;
LAB_00118b7a:
  MVar4 = ndigits_dec(local_138[local_1c0]);
  uVar2 = (int)local_1c0 * 9 + local_1a0 + uVar18 + (uint)((sf & 0x1000) != 0 || uVar18 != 0) +
          MVar4;
  if (p == (char *)0x0) {
    uVar21 = uVar2;
    if (uVar2 < local_1d4) {
      uVar21 = local_1d4;
    }
    uVar28 = (sb->p).ptr32;
    p = (char *)(ulong)uVar28;
    if ((sb->e).ptr32 - uVar28 < uVar21 + 8) {
      p = lj_buf_more2(sb,uVar21 + 8);
    }
  }
  if ((sf & 0x500) == 0) {
    uVar21 = local_1d4;
    if (uVar2 < local_1d4) {
      uVar21 = uVar2;
    }
    for (; uVar2 < local_1d4; local_1d4 = local_1d4 - 1) {
      *p = ' ';
      p = p + 1;
    }
    local_1d4 = uVar21 - 1;
  }
  if (!bVar33) {
    *p = local_1b8;
    p = p + 1;
  }
  if ((sf & 0x500) == 0x400) {
    uVar21 = uVar2;
    if (local_1d4 < uVar2) {
      uVar21 = local_1d4;
    }
    for (; uVar2 < local_1d4; local_1d4 = local_1d4 - 1) {
      *p = '0';
      p = p + 1;
    }
    local_1d4 = uVar21 - 1;
  }
  pcVar9 = lj_strfmt_wint(p,local_138[local_1c0]);
  while (bVar33 = local_1c0 != 0, local_1c0 = local_1c0 - 1, bVar33) {
    pcVar9 = lj_strfmt_wuint9(pcVar9,local_138[local_1c0]);
  }
  if ((sf & 0x1000) != 0 || uVar18 != 0) {
    *pcVar9 = '.';
    pcVar9 = pcVar9 + 1;
    lVar8 = (long)(int)uVar18;
    uVar26 = 0;
    while ((uVar21 = (uint)lVar8, 0 < (int)uVar21 && ((int)uVar26 != iVar20))) {
      uVar26 = (ulong)((int)uVar26 - 1U & 0x3f);
      pcVar9 = lj_strfmt_wuint9(pcVar9,local_138[uVar26]);
      lVar8 = lVar8 + -9;
    }
    if ((sf & 0x1010) == 0x10) {
      pcVar9 = pcVar9 + (int)((int)uVar21 >> 0x1f & uVar21);
      do {
        pcVar7 = pcVar9;
        pcVar9 = pcVar7 + -1;
      } while (pcVar7[-1] == '0');
      if (pcVar7[-1] != '.') {
        pcVar9 = pcVar7;
      }
    }
    else {
      for (; 0 < (int)lVar8; lVar8 = lVar8 + -1) {
        *pcVar9 = '0';
        pcVar9 = pcVar9 + 1;
      }
      pcVar9 = pcVar9 + lVar8;
    }
  }
LAB_0011902a:
  if ((sf >> 8 & 1) != 0) {
    for (; uVar2 < local_1d4; local_1d4 = local_1d4 - 1) {
      *pcVar9 = ' ';
      pcVar9 = pcVar9 + 1;
    }
  }
  return pcVar9;
}

Assistant:

static char *lj_strfmt_wfnum(SBuf *sb, SFormat sf, lua_Number n, char *p)
{
  MSize width = STRFMT_WIDTH(sf), prec = STRFMT_PREC(sf), len;
  TValue t;
  t.n = n;
  if (LJ_UNLIKELY((t.u32.hi << 1) >= 0xffe00000)) {
    /* Handle non-finite values uniformly for %a, %e, %f, %g. */
    int prefix = 0, ch = (sf & STRFMT_F_UPPER) ? 0x202020 : 0;
    if (((t.u32.hi & 0x000fffff) | t.u32.lo) != 0) {
      ch ^= ('n' << 16) | ('a' << 8) | 'n';
      if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    } else {
      ch ^= ('i' << 16) | ('n' << 8) | 'f';
      if ((t.u32.hi & 0x80000000)) prefix = '-';
      else if ((sf & STRFMT_F_PLUS)) prefix = '+';
      else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    }
    len = 3 + (prefix != 0);
    if (!p) p = lj_buf_more(sb, width > len ? width : len);
    if (!(sf & STRFMT_F_LEFT)) while (width-- > len) *p++ = ' ';
    if (prefix) *p++ = prefix;
    *p++ = (char)(ch >> 16); *p++ = (char)(ch >> 8); *p++ = (char)ch;
  } else if (STRFMT_FP(sf) == STRFMT_FP(STRFMT_T_FP_A)) {
    /* %a */
    const char *hexdig = (sf & STRFMT_F_UPPER) ? "0123456789ABCDEFPX"
					       : "0123456789abcdefpx";
    int32_t e = (t.u32.hi >> 20) & 0x7ff;
    char prefix = 0, eprefix = '+';
    if (t.u32.hi & 0x80000000) prefix = '-';
    else if ((sf & STRFMT_F_PLUS)) prefix = '+';
    else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    t.u32.hi &= 0xfffff;
    if (e) {
      t.u32.hi |= 0x100000;
      e -= 1023;
    } else if (t.u32.lo | t.u32.hi) {
      /* Non-zero denormal - normalise it. */
      uint32_t shift = t.u32.hi ? 20-lj_fls(t.u32.hi) : 52-lj_fls(t.u32.lo);
      e = -1022 - shift;
      t.u64 <<= shift;
    }
    /* abs(n) == t.u64 * 2^(e - 52) */
    /* If n != 0, bit 52 of t.u64 is set, and is the highest set bit. */
    if ((int32_t)prec < 0) {
      /* Default precision: use smallest precision giving exact result. */
      prec = t.u32.lo ? 13-lj_ffs(t.u32.lo)/4 : 5-lj_ffs(t.u32.hi|0x100000)/4;
    } else if (prec < 13) {
      /* Precision is sufficiently low as to maybe require rounding. */
      t.u64 += (((uint64_t)1) << (51 - prec*4));
    }
    if (e < 0) {
      eprefix = '-';
      e = -e;
    }
    len = 5 + ndigits_dec((uint32_t)e) + prec + (prefix != 0)
	    + ((prec | (sf & STRFMT_F_ALT)) != 0);
    if (!p) p = lj_buf_more(sb, width > len ? width : len);
    if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
      while (width-- > len) *p++ = ' ';
    }
    if (prefix) *p++ = prefix;
    *p++ = '0';
    *p++ = hexdig[17]; /* x or X */
    if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
      while (width-- > len) *p++ = '0';
    }
    *p++ = '0' + (t.u32.hi >> 20); /* Usually '1', sometimes '0' or '2'. */
    if ((prec | (sf & STRFMT_F_ALT))) {
      /* Emit fractional part. */
      char *q = p + 1 + prec;
      *p = '.';
      if (prec < 13) t.u64 >>= (52 - prec*4);
      else while (prec > 13) p[prec--] = '0';
      while (prec) { p[prec--] = hexdig[t.u64 & 15]; t.u64 >>= 4; }
      p = q;
    }
    *p++ = hexdig[16]; /* p or P */
    *p++ = eprefix; /* + or - */
    p = lj_strfmt_wint(p, e);
  } else {
    /* %e or %f or %g - begin by converting n to "nd" format. */
    uint32_t nd[64];
    uint32_t ndhi = 0, ndlo, i;
    int32_t e = (t.u32.hi >> 20) & 0x7ff, ndebias = 0;
    char prefix = 0, *q;
    if (t.u32.hi & 0x80000000) prefix = '-';
    else if ((sf & STRFMT_F_PLUS)) prefix = '+';
    else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    prec += ((int32_t)prec >> 31) & 7; /* Default precision is 6. */
    if (STRFMT_FP(sf) == STRFMT_FP(STRFMT_T_FP_G)) {
      /* %g - decrement precision if non-zero (to make it like %e). */
      prec--;
      prec ^= (uint32_t)((int32_t)prec >> 31);
    }
    if ((sf & STRFMT_T_FP_E) && prec < 14 && n != 0) {
      /* Precision is sufficiently low that rescaling will probably work. */
      if ((ndebias = rescale_e[e >> 6])) {
	t.n = n * rescale_n[e >> 6];
	if (LJ_UNLIKELY(!e)) t.n *= 1e10, ndebias -= 10;
	t.u64 -= 2; /* Convert 2ulp below (later we convert 2ulp above). */
	nd[0] = 0x100000 | (t.u32.hi & 0xfffff);
	e = ((t.u32.hi >> 20) & 0x7ff) - 1075 - (ND_MUL2K_MAX_SHIFT < 29);
	goto load_t_lo; rescale_failed:
	t.n = n;
	e = (t.u32.hi >> 20) & 0x7ff;
	ndebias = ndhi = 0;
      }
    }
    nd[0] = t.u32.hi & 0xfffff;
    if (e == 0) e++; else nd[0] |= 0x100000;
    e -= 1043;
    if (t.u32.lo) {
      e -= 32 + (ND_MUL2K_MAX_SHIFT < 29); load_t_lo:
#if ND_MUL2K_MAX_SHIFT >= 29
      nd[0] = (nd[0] << 3) | (t.u32.lo >> 29);
      ndhi = nd_mul2k(nd, ndhi, 29, t.u32.lo & 0x1fffffff, sf);
#elif ND_MUL2K_MAX_SHIFT >= 11
      ndhi = nd_mul2k(nd, ndhi, 11, t.u32.lo >> 21, sf);
      ndhi = nd_mul2k(nd, ndhi, 11, (t.u32.lo >> 10) & 0x7ff, sf);
      ndhi = nd_mul2k(nd, ndhi, 11, (t.u32.lo <<  1) & 0x7ff, sf);
#else
#error "ND_MUL2K_MAX_SHIFT too small"
#endif
    }
    if (e >= 0) {
      ndhi = nd_mul2k(nd, ndhi, (uint32_t)e, 0, sf);
      ndlo = 0;
    } else {
      ndlo = nd_div2k(nd, ndhi, (uint32_t)-e, sf);
      if (ndhi && !nd[ndhi]) ndhi--;
    }
    /* abs(n) == nd * 10^ndebias (for slightly loose interpretation of ==) */
    if ((sf & STRFMT_T_FP_E)) {
      /* %e or %g - assume %e and start by calculating nd's exponent (nde). */
      char eprefix = '+';
      int32_t nde = -1;
      MSize hilen;
      if (ndlo && !nd[ndhi]) {
	ndhi = 64; do {} while (!nd[--ndhi]);
	nde -= 64 * 9;
      }
      hilen = ndigits_dec(nd[ndhi]);
      nde += ndhi * 9 + hilen;
      if (ndebias) {
	/*
	** Rescaling was performed, but this introduced some error, and might
	** have pushed us across a rounding boundary. We check whether this
	** error affected the result by introducing even more error (2ulp in
	** either direction), and seeing whether a rounding boundary was
	** crossed. Having already converted the -2ulp case, we save off its
	** most significant digits, convert the +2ulp case, and compare them.
	*/
	int32_t eidx = e + 70 + (ND_MUL2K_MAX_SHIFT < 29)
			 + (t.u32.lo >= 0xfffffffe && !(~t.u32.hi << 12));
	const int8_t *m_e = four_ulp_m_e + eidx * 2;
	lj_assertG_(G(sbufL(sb)), 0 <= eidx && eidx < 128, "bad eidx %d", eidx);
	nd[33] = nd[ndhi];
	nd[32] = nd[(ndhi - 1) & 0x3f];
	nd[31] = nd[(ndhi - 2) & 0x3f];
	nd_add_m10e(nd, ndhi, (uint8_t)*m_e, m_e[1]);
	if (LJ_UNLIKELY(!nd_similar(nd, ndhi, nd + 33, hilen, prec + 1))) {
	  goto rescale_failed;
	}
      }
      if ((int32_t)(prec - nde) < (0x3f & -(int32_t)ndlo) * 9) {
	/* Precision is sufficiently low as to maybe require rounding. */
	ndhi = nd_add_m10e(nd, ndhi, 5, nde - prec - 1);
	nde += (hilen != ndigits_dec(nd[ndhi]));
      }
      nde += ndebias;
      if ((sf & STRFMT_T_FP_F)) {
	/* %g */
	if ((int32_t)prec >= nde && nde >= -4) {
	  if (nde < 0) ndhi = 0;
	  prec -= nde;
	  goto g_format_like_f;
	} else if (!(sf & STRFMT_F_ALT) && prec && width > 5) {
	  /* Decrease precision in order to strip trailing zeroes. */
	  char tail[9];
	  uint32_t maxprec = hilen - 1 + ((ndhi - ndlo) & 0x3f) * 9;
	  if (prec >= maxprec) prec = maxprec;
	  else ndlo = (ndhi - (((int32_t)(prec - hilen) + 9) / 9)) & 0x3f;
	  i = prec - hilen - (((ndhi - ndlo) & 0x3f) * 9) + 10;
	  lj_strfmt_wuint9(tail, nd[ndlo]);
	  while (prec && tail[--i] == '0') {
	    prec--;
	    if (!i) {
	      if (ndlo == ndhi) { prec = 0; break; }
	      ndlo = (ndlo + 1) & 0x3f;
	      lj_strfmt_wuint9(tail, nd[ndlo]);
	      i = 9;
	    }
	  }
	}
      }
      if (nde < 0) {
	/* Make nde non-negative. */
	eprefix = '-';
	nde = -nde;
      }
      len = 3 + prec + (prefix != 0) + ndigits_dec((uint32_t)nde) + (nde < 10)
	      + ((prec | (sf & STRFMT_F_ALT)) != 0);
      if (!p) p = lj_buf_more(sb, (width > len ? width : len) + 5);
      if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
	while (width-- > len) *p++ = ' ';
      }
      if (prefix) *p++ = prefix;
      if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
	while (width-- > len) *p++ = '0';
      }
      q = lj_strfmt_wint(p + 1, nd[ndhi]);
      p[0] = p[1]; /* Put leading digit in the correct place. */
      if ((prec | (sf & STRFMT_F_ALT))) {
	/* Emit fractional part. */
	p[1] = '.'; p += 2;
	prec -= (MSize)(q - p); p = q; /* Account for digits already emitted. */
	/* Then emit chunks of 9 digits (this may emit 8 digits too many). */
	for (i = ndhi; (int32_t)prec > 0 && i != ndlo; prec -= 9) {
	  i = (i - 1) & 0x3f;
	  p = lj_strfmt_wuint9(p, nd[i]);
	}
	if ((sf & STRFMT_T_FP_F) && !(sf & STRFMT_F_ALT)) {
	  /* %g (and not %#g) - strip trailing zeroes. */
	  p += (int32_t)prec & ((int32_t)prec >> 31);
	  while (p[-1] == '0') p--;
	  if (p[-1] == '.') p--;
	} else {
	  /* %e (or %#g) - emit trailing zeroes. */
	  while ((int32_t)prec > 0) { *p++ = '0'; prec--; }
	  p += (int32_t)prec;
	}
      } else {
	p++;
      }
      *p++ = (sf & STRFMT_F_UPPER) ? 'E' : 'e';
      *p++ = eprefix; /* + or - */
      if (nde < 10) *p++ = '0'; /* Always at least two digits of exponent. */
      p = lj_strfmt_wint(p, nde);
    } else {
      /* %f (or, shortly, %g in %f style) */
      if (prec < (MSize)(0x3f & -(int32_t)ndlo) * 9) {
	/* Precision is sufficiently low as to maybe require rounding. */
	ndhi = nd_add_m10e(nd, ndhi, 5, 0 - prec - 1);
      }
      g_format_like_f:
      if ((sf & STRFMT_T_FP_E) && !(sf & STRFMT_F_ALT) && prec && width) {
	/* Decrease precision in order to strip trailing zeroes. */
	if (ndlo) {
	  /* nd has a fractional part; we need to look at its digits. */
	  char tail[9];
	  uint32_t maxprec = (64 - ndlo) * 9;
	  if (prec >= maxprec) prec = maxprec;
	  else ndlo = 64 - (prec + 8) / 9;
	  i = prec - ((63 - ndlo) * 9);
	  lj_strfmt_wuint9(tail, nd[ndlo]);
	  while (prec && tail[--i] == '0') {
	    prec--;
	    if (!i) {
	      if (ndlo == 63) { prec = 0; break; }
	      lj_strfmt_wuint9(tail, nd[++ndlo]);
	      i = 9;
	    }
	  }
	} else {
	  /* nd has no fractional part, so precision goes straight to zero. */
	  prec = 0;
	}
      }
      len = ndhi * 9 + ndigits_dec(nd[ndhi]) + prec + (prefix != 0)
		     + ((prec | (sf & STRFMT_F_ALT)) != 0);
      if (!p) p = lj_buf_more(sb, (width > len ? width : len) + 8);
      if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
	while (width-- > len) *p++ = ' ';
      }
      if (prefix) *p++ = prefix;
      if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
	while (width-- > len) *p++ = '0';
      }
      /* Emit integer part. */
      p = lj_strfmt_wint(p, nd[ndhi]);
      i = ndhi;
      while (i) p = lj_strfmt_wuint9(p, nd[--i]);
      if ((prec | (sf & STRFMT_F_ALT))) {
	/* Emit fractional part. */
	*p++ = '.';
	/* Emit chunks of 9 digits (this may emit 8 digits too many). */
	while ((int32_t)prec > 0 && i != ndlo) {
	  i = (i - 1) & 0x3f;
	  p = lj_strfmt_wuint9(p, nd[i]);
	  prec -= 9;
	}
	if ((sf & STRFMT_T_FP_E) && !(sf & STRFMT_F_ALT)) {
	  /* %g (and not %#g) - strip trailing zeroes. */
	  p += (int32_t)prec & ((int32_t)prec >> 31);
	  while (p[-1] == '0') p--;
	  if (p[-1] == '.') p--;
	} else {
	  /* %f (or %#g) - emit trailing zeroes. */
	  while ((int32_t)prec > 0) { *p++ = '0'; prec--; }
	  p += (int32_t)prec;
	}
      }
    }
  }
  if ((sf & STRFMT_F_LEFT)) while (width-- > len) *p++ = ' ';
  return p;
}